

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmmath.c
# Opt level: O0

double lj_vm_foldfpm(double x,int fpm)

{
  undefined4 in_EDI;
  double in_XMM0_Qa;
  double local_8;
  
  switch(in_EDI) {
  case 0:
    local_8 = (double)lj_vm_floor(in_XMM0_Qa);
    break;
  case 1:
    local_8 = (double)lj_vm_ceil(in_XMM0_Qa);
    break;
  case 2:
    local_8 = (double)lj_vm_trunc(in_XMM0_Qa);
    break;
  case 3:
    local_8 = sqrt(in_XMM0_Qa);
    break;
  case 4:
    local_8 = log(in_XMM0_Qa);
    break;
  case 5:
    local_8 = log2(in_XMM0_Qa);
    break;
  default:
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double lj_vm_foldfpm(double x, int fpm)
{
  switch (fpm) {
  case IRFPM_FLOOR: return lj_vm_floor(x);
  case IRFPM_CEIL: return lj_vm_ceil(x);
  case IRFPM_TRUNC: return lj_vm_trunc(x);
  case IRFPM_SQRT: return sqrt(x);
  case IRFPM_LOG: return log(x);
  case IRFPM_LOG2: return lj_vm_log2(x);
  default: lj_assertX(0, "bad fpm %d", fpm);
  }
  return 0;
}